

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

int uv_thread_create(uv_thread_t *tid,_func_void_void_ptr *entry,void *arg)

{
  int iVar1;
  undefined1 local_70 [8];
  pthread_attr_t attr_storage;
  pthread_attr_t *attr;
  size_t stack_size;
  void *pvStack_20;
  int err;
  void *arg_local;
  _func_void_void_ptr *entry_local;
  uv_thread_t *tid_local;
  
  attr_storage._48_8_ = 0;
  pvStack_20 = arg;
  arg_local = entry;
  entry_local = (_func_void_void_ptr *)tid;
  attr = (pthread_attr_t *)thread_stack_size();
  if (attr != (pthread_attr_t *)0x0) {
    attr_storage._48_8_ = local_70;
    iVar1 = pthread_attr_init((pthread_attr_t *)attr_storage._48_8_);
    if (iVar1 != 0) {
      abort();
    }
    iVar1 = pthread_attr_setstacksize((pthread_attr_t *)attr_storage._48_8_,(size_t)attr);
    if (iVar1 != 0) {
      abort();
    }
  }
  stack_size._4_4_ =
       pthread_create((pthread_t *)entry_local,(pthread_attr_t *)attr_storage._48_8_,
                      (__start_routine *)arg_local,pvStack_20);
  if (attr_storage._48_8_ != 0) {
    pthread_attr_destroy((pthread_attr_t *)attr_storage._48_8_);
  }
  return -stack_size._4_4_;
}

Assistant:

int uv_thread_create(uv_thread_t *tid, void (*entry)(void *arg), void *arg) {
  int err;
  size_t stack_size;
  pthread_attr_t* attr;
  pthread_attr_t attr_storage;

  attr = NULL;
  stack_size = thread_stack_size();

  if (stack_size > 0) {
    attr = &attr_storage;

    if (pthread_attr_init(attr))
      abort();

    if (pthread_attr_setstacksize(attr, stack_size))
      abort();
  }

  err = pthread_create(tid, attr, (void*(*)(void*)) entry, arg);

  if (attr != NULL)
    pthread_attr_destroy(attr);

  return UV__ERR(err);
}